

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O2

bool __thiscall
dg::vr::ValueRelations::has<dg::vr::Bucket>(ValueRelations *this,Bucket *val,Relations rels)

{
  bool bVar1;
  const_iterator cVar2;
  _Base_bitset<1UL> local_20;
  key_type local_18;
  
  local_20._M_w = (_WordT)rels.bits.super__Base_bitset<1UL>._M_w;
  if ((((ulong)rels.bits.super__Base_bitset<1UL>._M_w & 1) != 0) &&
     (local_18._M_data = val,
     cVar2 = std::
             _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
             ::find(&(this->bucketToVals)._M_t,&local_18),
     8 < (ulong)((long)cVar2._M_node[1]._M_left - (long)cVar2._M_node[1]._M_parent))) {
    return true;
  }
  std::bitset<12UL>::set((bitset<12UL> *)&local_20,0,false);
  bVar1 = Bucket::hasAnyRelation(val,(Relations)local_20._M_w);
  return bVar1;
}

Assistant:

bool has(const X &val, Relations rels) const {
        HandlePtr mVal = maybeGet(val);
        return mVal && ((rels.has(Relations::EQ) &&
                         bucketToVals.find(*mVal)->second.size() > 1) ||
                        mVal->hasAnyRelation(rels.set(Relations::EQ, false)));
    }